

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_ManSatSolveCSat(Cec_ManPat_t *pPat,Gia_Man_t *pAig,Cec_ParSat_t *pPars)

{
  char cVar1;
  int iVar2;
  int iStart;
  Vec_Int_t *vPat;
  Vec_Int_t *vCexStore;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  abctime aVar5;
  long lVar6;
  Vec_Str_t *vStatus;
  Vec_Str_t *local_40;
  Cec_ParSat_t *local_38;
  
  vPat = Vec_IntAlloc(1000);
  local_38 = pPars;
  vCexStore = Cbs_ManSolveMiterNc(pAig,pPars->nBTLimit,&local_40,0);
  iVar2 = local_40->nSize;
  if (iVar2 != pAig->vCos->nSize) {
    __assert_fail("Vec_StrSize(vStatus) == Gia_ManCoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x304,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
  }
  if (pPat != (Cec_ManPat_t *)0x0) {
    pPat->iStart = pPat->vStorage->nSize;
    pPat->nPats = 0;
    pPat->nPatLits = 0;
    pPat->nPatLitsMin = 0;
  }
  iStart = 0;
  for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
    pGVar3 = Gia_ManCo(pAig,(int)lVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (local_40->nSize <= lVar6) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    cVar1 = local_40->pArray[lVar6];
    *(ulong *)pGVar3 =
         (ulong)(cVar1 == '\x01') << 0x3e |
         *(ulong *)pGVar3 & 0xbfffffffbfffffff | (ulong)((uint)(cVar1 == '\0') << 0x1e);
    if ((0 < vCexStore->nSize) && (cVar1 != '\x01')) {
      iStart = Cec_ManSatSolveExractPattern(vCexStore,iStart,vPat);
    }
    if (cVar1 == '\0') {
      if ((pPat != (Cec_ManPat_t *)0x0) && (0 < vPat->nSize)) {
        aVar4 = Abc_Clock();
        Cec_ManPatSavePatternCSat(pPat,vPat);
        aVar5 = Abc_Clock();
        pPat->timeTotalSave = pPat->timeTotalSave + (aVar5 - aVar4);
      }
      if (local_38->fCheckMiter != 0) break;
    }
    iVar2 = pAig->vCos->nSize;
  }
  if (iStart == vCexStore->nSize) {
    Vec_IntFree(vPat);
    free(local_40->pArray);
    free(local_40);
    Vec_IntFree(vCexStore);
    return;
  }
  __assert_fail("iStart == Vec_IntSize(vCexStore)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                ,0x321,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
}

Assistant:

void Cec_ManSatSolveCSat( Cec_ManPat_t * pPat, Gia_Man_t * pAig, Cec_ParSat_t * pPars )
{
    Vec_Str_t * vStatus;
    Vec_Int_t * vPat = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCexStore = Cbs_ManSolveMiterNc( pAig, pPars->nBTLimit, &vStatus, 0 );
    Gia_Obj_t * pObj;
    int i, status, iStart = 0;
    assert( Vec_StrSize(vStatus) == Gia_ManCoNum(pAig) );
    // reset the manager
    if ( pPat )
    {
        pPat->iStart = Vec_StrSize(pPat->vStorage);
        pPat->nPats = 0;
        pPat->nPatLits = 0;
        pPat->nPatLitsMin = 0;
    } 
    Gia_ManForEachCo( pAig, pObj, i )
    {
        status = (int)Vec_StrEntry(vStatus, i);
        pObj->fMark0 = (status == 0);
        pObj->fMark1 = (status == 1);
        if ( Vec_IntSize(vCexStore) > 0 && status != 1 )
            iStart = Cec_ManSatSolveExractPattern( vCexStore, iStart, vPat );
        if ( status != 0 )
            continue;
        // save the pattern
        if ( pPat && Vec_IntSize(vPat) > 0 )
        {
            abctime clk3 = Abc_Clock();
            Cec_ManPatSavePatternCSat( pPat, vPat );
            pPat->timeTotalSave += Abc_Clock() - clk3;
        }
        // quit if one of them is solved
        if ( pPars->fCheckMiter )
            break;
    }
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_IntFree( vPat );
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
}